

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O0

bool __thiscall Transformed::intersect(Transformed *this,Ray *ray,Hit *result)

{
  undefined8 *puVar1;
  point p;
  undefined8 *in_RDX;
  mat4f *in_RDI;
  bool bVar2;
  vec3f vVar3;
  vec4f vVar4;
  bool b;
  Hit iresult;
  Ray iray;
  Hit *in_stack_fffffffffffffd20;
  vec4f *this_00;
  vec3f *Ng;
  vec3f *pvVar5;
  point *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  float pw;
  vec4f *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  vec3f *in_stack_fffffffffffffd88;
  mat4f *in_stack_fffffffffffffd90;
  vec4f local_238;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  vec3f local_1f8 [5];
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  vec4f local_198 [4];
  undefined8 local_158;
  float local_150;
  undefined8 local_148;
  float local_140;
  undefined8 local_138;
  float local_130;
  undefined8 local_12c;
  undefined8 uStack_124;
  undefined8 local_11c;
  undefined8 uStack_114;
  undefined8 local_10c;
  undefined8 uStack_104;
  undefined8 local_fc;
  undefined8 uStack_f4;
  undefined8 local_ec;
  byte local_e1;
  undefined1 local_e0 [48];
  vec3f local_b0;
  vec3f local_a4;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  Ray local_38;
  undefined8 *local_20;
  
  pvVar5 = (vec3f *)(in_RDI[1].data + 1);
  local_20 = in_RDX;
  vVar3 = transformedPoint(in_RDI,pvVar5);
  local_50 = vVar3.z;
  local_58 = vVar3._0_8_;
  local_48 = local_58;
  local_40 = local_50;
  vVar3 = transformedDir(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  local_90 = vVar3.z;
  local_98 = vVar3._0_8_;
  local_80 = local_40;
  local_88 = local_48;
  p.z = local_40;
  p.x = (float)(undefined4)local_48;
  p.y = (float)local_48._4_4_;
  local_78 = local_98;
  local_70 = local_90;
  local_68 = local_98;
  local_60 = local_90;
  Ray::Ray(&local_38,p,vVar3);
  Primitive::Hit::Hit(in_stack_fffffffffffffd20);
  puVar1 = *(undefined8 **)(in_RDI->data[0] + 2);
  local_e1 = (**(code **)*puVar1)(puVar1,&local_38,local_e0);
  local_e1 = local_e1 & 1;
  bVar2 = local_e1 != 0;
  if (bVar2) {
    vVar3 = transformedPoint(in_RDI,pvVar5);
    local_140 = vVar3.z;
    local_148 = vVar3._0_8_;
    Ng = (vec3f *)(in_RDI[1].data + 1);
    this_00 = local_198;
    local_138 = local_148;
    local_130 = local_140;
    transposed(in_stack_fffffffffffffd90);
    vVar3 = transformedDir(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_1a0 = vVar3.z;
    local_1a8 = vVar3._0_8_;
    pvVar5 = local_1f8;
    local_158 = local_1a8;
    local_150 = local_1a0;
    transposed(in_stack_fffffffffffffd90);
    vVar3 = transformedDir(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_200 = vVar3.z;
    local_208 = vVar3._0_8_;
    local_1b8 = local_208;
    local_1b0 = local_200;
    Primitive::Hit::Hit((Hit *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                        in_stack_fffffffffffffd38,pvVar5,Ng,(vec2f *)this_00);
    local_20[8] = local_ec;
    local_20[6] = local_fc;
    local_20[7] = uStack_f4;
    local_20[4] = local_10c;
    local_20[5] = uStack_104;
    local_20[2] = local_11c;
    local_20[3] = uStack_114;
    *local_20 = local_12c;
    local_20[1] = uStack_124;
    pw = 0.0;
    vec4f::vec4f(&local_238,&local_b0,0.0);
    vVar4 = ::operator*((mat4f *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                        in_stack_fffffffffffffd78);
    local_228 = vVar4._0_8_;
    local_220 = vVar4._8_8_;
    vVar3 = vec4f::xyz(this_00);
    local_210 = vVar3.z;
    local_218 = vVar3._0_8_;
    *(float *)(local_20 + 7) = local_210;
    local_20[6] = local_218;
    vec4f::vec4f((vec4f *)&stack0xfffffffffffffd8c,&local_a4,pw);
    ::operator*((mat4f *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                in_stack_fffffffffffffd78);
    vVar3 = vec4f::xyz(this_00);
    *(long *)((long)local_20 + 0x3c) = vVar3._0_8_;
    *(float *)((long)local_20 + 0x44) = vVar3.z;
  }
  return bVar2;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		Ray iray(transformedPoint(invTrans, ray.origin), transformedDir(invTrans, ray.dir));
		Hit iresult;
		bool b = inner->intersect(iray, &iresult);
		if (!b) return false;
		*result = Hit(
			transformedPoint(trans, iresult.p),
			transformedDir(transposed(invTrans), iresult.Ns),
			transformedDir(transposed(invTrans), iresult.Ng),
			iresult.uv);
		result->dpdu = (trans * vec4f(iresult.dpdu, 0)).xyz();
		result->dpdv = (trans * vec4f(iresult.dpdv, 0)).xyz();
		return true;
	}